

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ScatterNDLayerParams::SerializeWithCachedSizes
          (ScatterNDLayerParams *this,CodedOutputStream *output)

{
  if (this->mode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->mode_,output);
    return;
  }
  return;
}

Assistant:

void ScatterNDLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ScatterNDLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.ScatterMode mode = 1;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->mode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ScatterNDLayerParams)
}